

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiKeyRoutingTable::Clear(ImGuiKeyRoutingTable *this)

{
  long in_RDI;
  int n;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < 0x8c; iVar1 = iVar1 + 1) {
    *(undefined2 *)(in_RDI + (long)iVar1 * 2) = 0xffff;
  }
  ImVector<ImGuiKeyRoutingData>::clear
            ((ImVector<ImGuiKeyRoutingData> *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  ImVector<ImGuiKeyRoutingData>::clear
            ((ImVector<ImGuiKeyRoutingData> *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void Clear()                    { for (int n = 0; n < IM_ARRAYSIZE(Index); n++) Index[n] = -1; Entries.clear(); EntriesNext.clear(); }